

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_switch_Dyy_unconditional(response_layer *layer,integral_image *iimage)

{
  undefined1 auVar1 [16];
  long lVar2;
  integral_image *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  integral_image *in_stack_000000b8;
  response_layer *in_stack_000000c0;
  undefined8 uStack_170;
  float afStack_168 [2];
  uint local_160;
  int local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  long local_148;
  int local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  int local_128;
  int local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  int local_110;
  int local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  int local_f8;
  int local_f4;
  ulong local_f0;
  unsigned_long __vla_expr0;
  int local_dc;
  int local_d8;
  int y;
  int x;
  int j;
  int i;
  int k0;
  int k;
  int ind;
  bool *laplacian;
  float *response;
  int c01;
  int c00;
  int r01;
  int r00;
  int c11;
  int c10;
  int r11;
  int r10;
  float D1;
  float D0;
  float C1;
  float C0;
  float B1;
  float B0;
  float A1;
  float A0;
  float D;
  float C;
  float B;
  float A;
  float Dyy1;
  float Dyy0;
  float Dxy;
  float Dyy;
  float Dxx;
  float inv_area;
  int lobe;
  int border;
  int filter_size;
  int step;
  float *data;
  uint local_28;
  int iheight;
  int iwidth;
  int data_width;
  int width;
  int height;
  integral_image *iimage_local;
  response_layer *layer_local;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  __vla_expr0 = (unsigned_long)afStack_168;
  data_width = layer->height;
  iwidth = layer->width;
  iheight = iimage->data_width;
  local_28 = iimage->width;
  data._4_4_ = iimage->height;
  _filter_size = iimage->data;
  border = layer->step;
  lobe = layer->filter_size;
  inv_area = (float)((lobe + -1) / 2);
  Dxx = (float)(lobe / 3);
  Dyy = 1.0 / (float)(lobe * lobe);
  laplacian = (bool *)layer->response;
  _k = layer->laplacian;
  k0 = 0;
  local_d8 = 0;
  local_dc = 0;
  _width = iimage;
  iimage_local = (integral_image *)layer;
  if (data._4_4_ < lobe) {
    if ((int)inv_area < data._4_4_) {
      if ((int)Dxx * 2 + -1 < (int)local_28) {
        uStack_170 = 0x14a3a8;
        height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
      }
      else {
        uStack_170 = 0x14a3b7;
        height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
      }
    }
    else if ((int)Dxx < (int)local_28) {
      local_f0 = (ulong)local_28;
      lVar2 = -(local_f0 * 4 + 0xf & 0xfffffffffffffff0);
      local_148 = (long)afStack_168 + lVar2;
      for (x = 0; x < iwidth * border - (int)Dxx; x = border + x) {
        *(float *)(local_148 + (long)x * 4) =
             _filter_size[(data._4_4_ + -1) * iheight + x + (int)Dxx + -1];
      }
      A1 = _filter_size[(int)((data._4_4_ + -1) * iheight + (local_28 - 1))];
      for (; x < (int)Dxx; x = border + x) {
        *(float *)(local_148 + (long)x * 4) = A1;
      }
      for (; x < iwidth * border; x = border + x) {
        A0 = _filter_size[(data._4_4_ + -1) * iheight + (x - (int)Dxx)];
        *(float *)(local_148 + (long)x * 4) = A1 - A0;
      }
      for (local_d8 = 0; local_d8 < data_width * border; local_d8 = border + local_d8) {
        for (local_dc = 0; piVar3 = _width, fVar8 = Dxx, local_dc < iwidth * border;
            local_dc = border + local_dc) {
          local_160 = *(uint *)(local_148 + (long)local_dc * 4);
          iVar5 = local_d8 - (int)Dxx / 2;
          iVar4 = local_dc - (int)Dxx;
          iVar7 = (int)Dxx * 2;
          *(undefined8 *)((long)afStack_168 + lVar2 + -8) = 0x14ae6e;
          auVar12._0_4_ = box_integral_unconditional(piVar3,iVar5,iVar4 + 1,(int)fVar8,iVar7 + -1);
          piVar3 = _width;
          iVar4 = lobe;
          auVar12._4_60_ = extraout_var_02;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar12._0_16_,ZEXT416(local_160))
          ;
          Dyy0 = auVar1._0_4_;
          iVar6 = local_d8 - (int)Dxx;
          iVar7 = local_dc - (int)inv_area;
          iVar5 = (int)Dxx * 2;
          *(undefined8 *)((long)afStack_168 + lVar2 + -8) = 0x14aeb6;
          local_158 = box_integral_unconditional(piVar3,iVar6 + 1,iVar7,iVar5 + -1,iVar4);
          piVar3 = _width;
          fVar8 = Dxx;
          iVar7 = local_d8 - (int)Dxx;
          local_15c = local_dc;
          iVar5 = local_dc - (int)Dxx / 2;
          iVar4 = (int)Dxx * 2;
          *(undefined8 *)((long)afStack_168 + lVar2 + -8) = 0x14aefe;
          auVar13._0_4_ = box_integral_unconditional(piVar3,iVar7 + 1,iVar5,iVar4 + -1,(int)fVar8);
          piVar3 = _width;
          fVar8 = Dxx;
          auVar13._4_60_ = extraout_var_03;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar13._0_16_,
                                   ZEXT416((uint)local_158));
          Dxy = auVar1._0_4_;
          iVar5 = local_d8 - (int)Dxx;
          iVar4 = local_dc + 1;
          *(undefined8 *)((long)afStack_168 + lVar2 + -8) = 0x14af3e;
          local_154 = box_integral_unconditional(piVar3,iVar5,iVar4,(int)fVar8,(int)fVar8);
          piVar3 = _width;
          fVar8 = Dxx;
          iVar5 = local_d8 + 1;
          iVar4 = local_dc - (int)Dxx;
          *(undefined8 *)((long)afStack_168 + lVar2 + -8) = 0x14af68;
          local_150 = box_integral_unconditional(piVar3,iVar5,iVar4,(int)fVar8,(int)fVar8);
          piVar3 = _width;
          fVar8 = Dxx;
          local_150 = local_154 + local_150;
          iVar5 = local_d8 - (int)Dxx;
          iVar4 = local_dc - (int)Dxx;
          *(undefined8 *)((long)afStack_168 + lVar2 + -8) = 0x14afa2;
          local_14c = box_integral_unconditional(piVar3,iVar5,iVar4,(int)fVar8,(int)fVar8);
          piVar3 = _width;
          fVar8 = Dxx;
          local_14c = local_150 - local_14c;
          iVar5 = local_d8 + 1;
          iVar4 = local_dc + 1;
          *(undefined8 *)((long)afStack_168 + lVar2 + -8) = 0x14afdc;
          fVar8 = box_integral_unconditional(piVar3,iVar5,iVar4,(int)fVar8,(int)fVar8);
          Dyy0 = Dyy * Dyy0;
          Dxy = Dyy * Dxy;
          Dyy1 = Dyy * (local_14c - fVar8);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)Dyy0),ZEXT416((uint)Dxy),
                                   ZEXT416((uint)-(Dyy1 * 0.81 * Dyy1)));
          *(int *)(laplacian + (long)k0 * 4) = auVar1._0_4_;
          _k[k0] = 0.0 <= Dxy + Dyy0;
          k0 = k0 + 1;
        }
      }
    }
    else {
      r10 = (int)_filter_size[(int)((data._4_4_ + -1) * iheight + (local_28 - 1))];
      for (local_d8 = 0; local_f4 = local_d8, local_d8 < iwidth * border - (int)Dxx / 2;
          local_d8 = border + local_d8) {
        local_f8 = local_d8;
        c10 = (local_d8 - (int)Dxx / 2) + -1;
        c11 = c10 + (int)Dxx;
        r11 = (int)_filter_size[(int)(c11 * iheight + (local_28 - 1))];
        auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)r11),
                                 ZEXT416((uint)r10));
        Dyy0 = Dyy * auVar1._0_4_;
        for (local_dc = 0; local_dc < iwidth * border; local_dc = border + local_dc) {
          uStack_170 = 0x14a501;
          local_108 = box_integral_unconditional
                                (_width,(local_d8 - (int)Dxx) + 1,local_dc - (int)inv_area,
                                 (int)Dxx * 2 + -1,lobe);
          local_10c = local_dc;
          uStack_170 = 0x14a549;
          auVar9._0_4_ = box_integral_unconditional
                                   (_width,(local_d8 - (int)Dxx) + 1,local_dc - (int)Dxx / 2,
                                    (int)Dxx * 2 + -1,(int)Dxx);
          auVar9._4_60_ = extraout_var;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar9._0_16_,
                                   ZEXT416((uint)local_108));
          Dxy = auVar1._0_4_;
          uStack_170 = 0x14a589;
          local_104 = box_integral_unconditional
                                (_width,local_d8 - (int)Dxx,local_dc + 1,(int)Dxx,(int)Dxx);
          uStack_170 = 0x14a5b3;
          local_100 = box_integral_unconditional
                                (_width,local_d8 + 1,local_dc - (int)Dxx,(int)Dxx,(int)Dxx);
          local_100 = local_104 + local_100;
          uStack_170 = 0x14a5ed;
          local_fc = box_integral_unconditional
                               (_width,local_d8 - (int)Dxx,local_dc - (int)Dxx,(int)Dxx,(int)Dxx);
          local_fc = local_100 - local_fc;
          uStack_170 = 0x14a627;
          fVar8 = box_integral_unconditional(_width,local_d8 + 1,local_dc + 1,(int)Dxx,(int)Dxx);
          Dxy = Dyy * Dxy;
          Dyy1 = Dyy * (local_fc - fVar8);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)Dyy0),ZEXT416((uint)Dxy),
                                   ZEXT416((uint)-(Dyy1 * 0.81 * Dyy1)));
          *(int *)(laplacian + (long)k0 * 4) = auVar1._0_4_;
          _k[k0] = 0.0 <= Dxy + Dyy0;
          k0 = k0 + 1;
        }
      }
      Dyy0 = Dyy * (float)r10 * -2.0;
      for (; local_110 = local_d8, local_d8 < (int)Dxx / 2 + 1; local_d8 = border + local_d8) {
        for (local_dc = 0; local_dc < iwidth * border; local_dc = border + local_dc) {
          uStack_170 = 0x14a794;
          local_120 = box_integral_unconditional
                                (_width,(local_d8 - (int)Dxx) + 1,local_dc - (int)inv_area,
                                 (int)Dxx * 2 + -1,lobe);
          local_124 = local_dc;
          uStack_170 = 0x14a7dc;
          auVar10._0_4_ =
               box_integral_unconditional
                         (_width,(local_d8 - (int)Dxx) + 1,local_dc - (int)Dxx / 2,(int)Dxx * 2 + -1
                          ,(int)Dxx);
          auVar10._4_60_ = extraout_var_00;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar10._0_16_,
                                   ZEXT416((uint)local_120));
          Dxy = auVar1._0_4_;
          uStack_170 = 0x14a81c;
          local_11c = box_integral_unconditional
                                (_width,local_d8 - (int)Dxx,local_dc + 1,(int)Dxx,(int)Dxx);
          uStack_170 = 0x14a846;
          local_118 = box_integral_unconditional
                                (_width,local_d8 + 1,local_dc - (int)Dxx,(int)Dxx,(int)Dxx);
          local_118 = local_11c + local_118;
          uStack_170 = 0x14a880;
          local_114 = box_integral_unconditional
                                (_width,local_d8 - (int)Dxx,local_dc - (int)Dxx,(int)Dxx,(int)Dxx);
          local_114 = local_118 - local_114;
          uStack_170 = 0x14a8ba;
          fVar8 = box_integral_unconditional(_width,local_d8 + 1,local_dc + 1,(int)Dxx,(int)Dxx);
          Dxy = Dyy * Dxy;
          Dyy1 = Dyy * (local_114 - fVar8);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)Dyy0),ZEXT416((uint)Dxy),
                                   ZEXT416((uint)-(Dyy1 * 0.81 * Dyy1)));
          *(int *)(laplacian + (long)k0 * 4) = auVar1._0_4_;
          _k[k0] = 0.0 <= Dxy + Dyy0;
          k0 = k0 + 1;
        }
      }
      for (; local_d8 < data_width * border; local_d8 = border + local_d8) {
        local_128 = local_d8;
        c10 = (local_d8 - (int)Dxx / 2) + -1;
        D = _filter_size[(int)(c10 * iheight + (local_28 - 1))];
        auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)D),
                                 ZEXT416((uint)-((float)r10 * 2.0)));
        Dyy0 = Dyy * auVar1._0_4_;
        for (local_dc = 0; local_dc < iwidth * border; local_dc = border + local_dc) {
          uStack_170 = 0x14aa80;
          local_138 = box_integral_unconditional
                                (_width,(local_d8 - (int)Dxx) + 1,local_dc - (int)inv_area,
                                 (int)Dxx * 2 + -1,lobe);
          local_13c = local_dc;
          uStack_170 = 0x14aac8;
          auVar11._0_4_ =
               box_integral_unconditional
                         (_width,(local_d8 - (int)Dxx) + 1,local_dc - (int)Dxx / 2,(int)Dxx * 2 + -1
                          ,(int)Dxx);
          auVar11._4_60_ = extraout_var_01;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar11._0_16_,
                                   ZEXT416((uint)local_138));
          Dxy = auVar1._0_4_;
          uStack_170 = 0x14ab08;
          local_134 = box_integral_unconditional
                                (_width,local_d8 - (int)Dxx,local_dc + 1,(int)Dxx,(int)Dxx);
          uStack_170 = 0x14ab32;
          local_130 = box_integral_unconditional
                                (_width,local_d8 + 1,local_dc - (int)Dxx,(int)Dxx,(int)Dxx);
          local_130 = local_134 + local_130;
          uStack_170 = 0x14ab6c;
          local_12c = box_integral_unconditional
                                (_width,local_d8 - (int)Dxx,local_dc - (int)Dxx,(int)Dxx,(int)Dxx);
          local_12c = local_130 - local_12c;
          uStack_170 = 0x14aba6;
          fVar8 = box_integral_unconditional(_width,local_d8 + 1,local_dc + 1,(int)Dxx,(int)Dxx);
          Dxy = Dyy * Dxy;
          Dyy1 = Dyy * (local_12c - fVar8);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)Dyy0),ZEXT416((uint)Dxy),
                                   ZEXT416((uint)-(Dyy1 * 0.81 * Dyy1)));
          *(int *)(laplacian + (long)k0 * 4) = auVar1._0_4_;
          _k[k0] = 0.0 <= Dxy + Dyy0;
          k0 = k0 + 1;
        }
      }
    }
  }
  else {
    uStack_170 = 0x14a37f;
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_000000c0,in_stack_000000b8);
  }
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function:
        - compute_response_layer_switch_Dyy
        (- compute_response_layer_unconditional)

        optimization:
        - box_integral_unconditional instead of box_integral
            => makes use of padded image and removes all conditionals
        - uses compute_response_layer_Dyy_laplacian_locality_uncond_opt_flops_inlined
            => best function for filter_size <= iheight
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        // 2. Case The filter is somewhat larger than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image. Blue lines edition brings the switch into Dyy
            // Idea: Do compute_response_layer_Dyy_leftcorner
            // but everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO: fix this

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    for (y = 0; y < width*step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {
                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height * step; x += step) {

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}